

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumHelpers.hpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
enum_to_str<FileSection>
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,FileSection p_enum_value,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>_>_>
          *p_mapping)

{
  _Base_ptr p_Var1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>
  pair;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>
  local_50;
  
  p_Var1 = (p_mapping->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var1 == &(p_mapping->_M_t)._M_impl.super__Rb_tree_header) {
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      return __return_storage_ptr__;
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>
    ::pair(&local_50,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>
            *)(p_Var1 + 1));
    if (local_50.second == p_enum_value) break;
    std::__cxx11::string::~string((string *)&local_50);
    p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
  }
  std::_Optional_payload_base<std::__cxx11::string>::
  _Optional_payload_base<std::__cxx11::string_const&>
            ((_Optional_payload_base<std::__cxx11::string> *)__return_storage_ptr__,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

optional<string> enum_to_str(E p_enum_value, map<string,E,ci_less> p_mapping)
{
	for(auto pair : p_mapping)
	{
		if(pair.second == p_enum_value)
		{
			return optional<string>(pair.first);
		}
	}

	return std::nullopt;
}